

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O3

QPixmap * __thiscall
QPixmap::transformed
          (QPixmap *__return_storage_ptr__,QPixmap *this,QTransform *transform,
          TransformationMode mode)

{
  QPlatformPixmap *pQVar1;
  TransformationType TVar2;
  
  pQVar1 = (this->data).d.ptr;
  if (((pQVar1 != (QPlatformPixmap *)0x0) && (pQVar1->is_null == false)) &&
     (TVar2 = QTransform::type(transform), 1 < (int)TVar2)) {
    pQVar1 = (this->data).d.ptr;
    (*pQVar1->_vptr_QPlatformPixmap[0x10])(__return_storage_ptr__,pQVar1,transform,(ulong)mode);
    return __return_storage_ptr__;
  }
  QPixmap(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

QPixmap QPixmap::transformed(const QTransform &transform,
                             Qt::TransformationMode mode) const
{
    if (isNull() || transform.type() <= QTransform::TxTranslate)
        return *this;

    return data->transformed(transform, mode);
}